

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::sparse_hashtable<$6111fa4$>::sparse_hashtable
          (sparse_hashtable<_6111fa4_> *this,size_type expected_max_items_in_table,Hasher *hf,
          Hasher *eql,SelectKey *ext,SetKey *set,
          libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *alloc)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined1 local_19;
  
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .super_Hasher.num_compares_ = hf->num_compares_;
  iVar1 = hf->num_hashes_;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .super_Hasher.id_ = hf->id_;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .super_Hasher.num_hashes_ = iVar1;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .consider_shrink_ = false;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .use_empty_ = false;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .use_deleted_ = false;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .num_ht_copies_ = 0;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .enlarge_threshold_ = 0;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .shrink_threshold_ = 0;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .enlarge_factor_ = 0.8;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .shrink_factor_ = 0.32;
  iVar1 = eql->num_hashes_;
  (this->key_info).super_Hasher.id_ = eql->id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar1;
  (this->key_info).super_Hasher.num_compares_ = eql->num_compares_;
  (this->key_info).delkey._M_dataplus._M_p = (pointer)&(this->key_info).delkey.field_2;
  (this->key_info).delkey._M_string_length = 0;
  (this->key_info).delkey.field_2._M_local_buf[0] = '\0';
  this->num_deleted = 0;
  if (expected_max_items_in_table == 0) {
    sVar2 = 0x20;
  }
  else {
    sVar2 = sparsehash_internal::
            sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
            ::min_buckets((sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                           *)this,expected_max_items_in_table,0);
  }
  sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::sparsetable(&this->table,sVar2,&local_19);
  fVar4 = (float)(this->table).settings.table_size;
  fVar5 = (this->settings).
          super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
          .enlarge_factor_ * fVar4;
  uVar3 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar4 = fVar4 * (this->settings).
                  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                  .shrink_factor_;
  uVar3 = (ulong)fVar4;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .shrink_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .consider_shrink_ = false;
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }